

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemAloha.cpp
# Opt level: O0

void __thiscall
ProblemAloha::splitState(ProblemAloha *this,Index sI,Index *backlog,Index *newPacket)

{
  reference pvVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RCX;
  value_type *in_RDX;
  Index in_ESI;
  long in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> splitS;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vStackY_38;
  
  IndexTools::JointToIndividualIndicesStepSize(&vStackY_38,in_ESI,*(size_t **)(in_RDI + 0x728),2);
  pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&vStackY_38,0);
  *in_RDX = *pvVar1;
  pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&vStackY_38,1);
  *(value_type *)
   &(in_RCX->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_start = *pvVar1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_RCX);
  return;
}

Assistant:

void
ProblemAloha::splitState(Index sI, Index &backlog, Index &newPacket) const
{
    vector<Index> splitS=
        IndexTools::JointToIndividualIndicesStepSize(sI,_m_stepSizeState,2);
    backlog=splitS[0];
    newPacket=splitS[1];
}